

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.h
# Opt level: O2

Addr CfgNode::node2addr(CfgNode *node)

{
  if (1 < node->m_type - CFG_BLOCK) {
    return 0;
  }
  if (node->m_data != (Data *)0x0) {
    return node->m_data->m_addr;
  }
  __assert_fail("node->data() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                ,0x72,"static Addr CfgNode::node2addr(CfgNode *)");
}

Assistant:

enum CfgNode::Type type() const { return m_type; }